

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::lexCharacterConstant(Lexer *this,SyntaxToken *tk,uchar prefix)

{
  uint local_20;
  uint prefixSize;
  uchar prefix_local;
  SyntaxToken *tk_local;
  Lexer *this_local;
  
  local_20 = 1;
  if (prefix == 'L') {
    tk->syntaxK_ = CharacterConstant_L_Token;
  }
  else if (prefix == 'U') {
    tk->syntaxK_ = CharacterConstant_U_Token;
  }
  else {
    if (prefix != 'u') {
      tk->syntaxK_ = CharacterConstantToken;
    }
    else {
      tk->syntaxK_ = CharacterConstant_u_Token;
    }
    local_20 = (uint)(prefix == 'u');
  }
  lexUntilQuote(this,tk,'\'',local_20);
  return;
}

Assistant:

void Lexer::lexCharacterConstant(SyntaxToken* tk, unsigned char prefix)
{
    unsigned int prefixSize = 1;
    if (prefix == 'L')
        tk->syntaxK_ = SyntaxKind::CharacterConstant_L_Token;
    else if (prefix == 'U')
        tk->syntaxK_ = SyntaxKind::CharacterConstant_U_Token;
    else if (prefix == 'u')
        tk->syntaxK_ = SyntaxKind::CharacterConstant_u_Token;
    else {
        tk->syntaxK_ = SyntaxKind::CharacterConstantToken;
        prefixSize = 0;
    }

    lexUntilQuote(tk, '\'', prefixSize);
}